

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_param_test.cpp
# Opt level: O3

void sign_verify_generic_invoker(void)

{
  ulong *puVar1;
  ios_base *this;
  string local_1e8;
  undefined7 uStack_1e7;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [112];
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  ulong *puStack_50;
  undefined8 uStack_48;
  ulong auStack_40 [2];
  
  uStack_48 = 0;
  auStack_40[0] = 0;
  auStack_40[1] = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  puStack_50 = (ulong *)0x0;
  local_c8 = 0;
  uStack_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  local_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  local_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  local_1c8._64_8_ = 0;
  local_1c8._72_8_ = 0;
  local_1c8._80_8_ = 0;
  local_1c8._88_8_ = 0;
  local_1c8._96_8_ = 0;
  local_1c8._104_8_ = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  local_1c8._0_8_ = (_func_int **)0x0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = 0;
  local_1c8._24_8_ = 0;
  local_1c8._32_8_ = 0;
  local_1c8._40_8_ = 0;
  local_1c8._48_8_ = 0;
  local_1c8._56_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  local_1e8 = (string)0x22;
  uStack_48 = 0;
  auStack_40[0] = auStack_40[0] & 0xffffffffffffff00;
  puStack_50 = auStack_40;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1e8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"sign_verify_generic",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_50,&local_1e8);
  if ((undefined1 *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
    operator_delete((undefined1 *)CONCAT71(uStack_1e7,local_1e8));
  }
  puVar1 = puStack_50;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x37;
  if (puStack_50 != auStack_40) {
    operator_delete(puStack_50);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base((ios_base *)&uStack_158);
  uStack_48 = 0;
  auStack_40[0] = 0;
  auStack_40[1] = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  puStack_50 = (ulong *)0x0;
  local_c8 = 0;
  uStack_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  local_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  local_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  local_1c8._64_8_ = 0;
  local_1c8._72_8_ = 0;
  local_1c8._80_8_ = 0;
  local_1c8._88_8_ = 0;
  local_1c8._96_8_ = 0;
  local_1c8._104_8_ = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  local_1c8._0_8_ = (_func_int **)0x0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = 0;
  local_1c8._24_8_ = 0;
  local_1c8._32_8_ = 0;
  local_1c8._40_8_ = 0;
  local_1c8._48_8_ = 0;
  local_1c8._56_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  uStack_48 = 0;
  auStack_40[0] = auStack_40[0] & 0xffffffffffffff00;
  local_1e8 = (string)0x22;
  puStack_50 = auStack_40;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1e8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"sign_verify_generic",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_50,&local_1e8);
  if ((undefined1 *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
    operator_delete((undefined1 *)CONCAT71(uStack_1e7,local_1e8));
  }
  puVar1 = puStack_50;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x37;
  if (puStack_50 != auStack_40) {
    operator_delete(puStack_50);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base((ios_base *)&uStack_158);
  uStack_48 = 0;
  auStack_40[0] = 0;
  auStack_40[1] = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  puStack_50 = (ulong *)0x0;
  local_c8 = 0;
  uStack_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  local_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  local_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  local_1c8._64_8_ = 0;
  local_1c8._72_8_ = 0;
  local_1c8._80_8_ = 0;
  local_1c8._88_8_ = 0;
  local_1c8._96_8_ = 0;
  local_1c8._104_8_ = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  local_1c8._0_8_ = (_func_int **)0x0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = 0;
  local_1c8._24_8_ = 0;
  local_1c8._32_8_ = 0;
  local_1c8._40_8_ = 0;
  local_1c8._48_8_ = 0;
  local_1c8._56_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  uStack_48 = 0;
  auStack_40[0] = auStack_40[0] & 0xffffffffffffff00;
  local_1e8 = (string)0x22;
  puStack_50 = auStack_40;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1e8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"sign_verify_generic",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_50,&local_1e8);
  if ((undefined1 *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
    operator_delete((undefined1 *)CONCAT71(uStack_1e7,local_1e8));
  }
  puVar1 = puStack_50;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x37;
  if (puStack_50 != auStack_40) {
    operator_delete(puStack_50);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  this = (ios_base *)&uStack_158;
  std::ios_base::~ios_base(this);
  sign_verify_generic::test_method((sign_verify_generic *)this);
  uStack_48 = 0;
  auStack_40[0] = 0;
  auStack_40[1] = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  puStack_50 = (ulong *)0x0;
  local_c8 = 0;
  uStack_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  local_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  local_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  local_1c8._64_8_ = 0;
  local_1c8._72_8_ = 0;
  local_1c8._80_8_ = 0;
  local_1c8._88_8_ = 0;
  local_1c8._96_8_ = 0;
  local_1c8._104_8_ = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  local_1c8._0_8_ = (_func_int **)0x0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = 0;
  local_1c8._24_8_ = 0;
  local_1c8._32_8_ = 0;
  local_1c8._40_8_ = 0;
  local_1c8._48_8_ = 0;
  local_1c8._56_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  uStack_48 = 0;
  auStack_40[0] = auStack_40[0] & 0xffffffffffffff00;
  local_1e8 = (string)0x22;
  puStack_50 = auStack_40;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1e8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"sign_verify_generic",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_50,&local_1e8);
  if ((undefined1 *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
    operator_delete((undefined1 *)CONCAT71(uStack_1e7,local_1e8));
  }
  puVar1 = puStack_50;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x37;
  if (puStack_50 != auStack_40) {
    operator_delete(puStack_50);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base((ios_base *)&uStack_158);
  uStack_48 = 0;
  auStack_40[0] = 0;
  auStack_40[1] = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  uStack_78 = 0;
  local_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  uStack_58 = 0;
  puStack_50 = (ulong *)0x0;
  local_c8 = 0;
  uStack_c0 = 0;
  uStack_b8 = 0;
  uStack_b0 = 0;
  uStack_a8 = 0;
  uStack_a0 = 0;
  uStack_98 = 0;
  uStack_90 = 0;
  local_108 = 0;
  uStack_100 = 0;
  uStack_f8 = 0;
  uStack_f0 = 0;
  uStack_e8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  uStack_d0 = 0;
  local_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  uStack_128 = 0;
  uStack_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  local_1c8._64_8_ = 0;
  local_1c8._72_8_ = 0;
  local_1c8._80_8_ = 0;
  local_1c8._88_8_ = 0;
  local_1c8._96_8_ = 0;
  local_1c8._104_8_ = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  local_1c8._0_8_ = (_func_int **)0x0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = 0;
  local_1c8._24_8_ = 0;
  local_1c8._32_8_ = 0;
  local_1c8._40_8_ = 0;
  local_1c8._48_8_ = 0;
  local_1c8._56_8_ = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1c8);
  uStack_48 = 0;
  auStack_40[0] = auStack_40[0] & 0xffffffffffffff00;
  local_1e8 = (string)0x22;
  puStack_50 = auStack_40;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,(char *)&local_1e8,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c8,"sign_verify_generic",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c8,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&puStack_50,&local_1e8);
  if ((undefined1 *)CONCAT71(uStack_1e7,local_1e8) != local_1d8) {
    operator_delete((undefined1 *)CONCAT71(uStack_1e7,local_1e8));
  }
  puVar1 = puStack_50;
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x17c8c0,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,(ulong)puVar1);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/IAIK[P]Picnic/tests/picnic_param_test.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x37;
  if (puStack_50 != auStack_40) {
    operator_delete(puStack_50);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1c8);
  std::ios_base::~ios_base((ios_base *)&uStack_158);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_verify_generic) {
  const size_t max_signature_size = PICNIC_CONCAT(PARAM, signature_size)();
  BOOST_TEST(max_signature_size);

  std::array<uint8_t, 32> m;
  randomize_container(m);

  // Create a key pair
  PICNIC_CONCAT(PARAM, privatekey_t) private_key;
  PICNIC_CONCAT(PARAM, publickey_t) public_key;
  BOOST_TEST(!PICNIC_CONCAT(PARAM, keygen)(&public_key, &private_key));

  // Valid key pair
  BOOST_TEST(!PICNIC_CONCAT(PARAM, validate_keypair)(&private_key, &public_key));

  // Serialize key pair
  std::vector<uint8_t> serialized_private_key;
  serialized_private_key.resize(PICNIC_CONCAT(PARAM, get_private_key_size()));
  BOOST_TEST(PICNIC_CONCAT(PARAM, write_private_key)(&private_key, serialized_private_key.data(),
                                                     serialized_private_key.size()) ==
             serialized_private_key.size());

  std::vector<uint8_t> serialized_public_key;
  serialized_public_key.resize(PICNIC_CONCAT(PARAM, get_public_key_size()));
  BOOST_TEST(PICNIC_CONCAT(PARAM, write_public_key)(&public_key, serialized_public_key.data(),
                                                    serialized_public_key.size()) ==
             serialized_public_key.size());

  // Deserialize key pair
  picnic_privatekey_t gen_private_key;
  picnic_publickey_t gen_public_key;
  BOOST_TEST(!picnic_read_private_key(&gen_private_key, serialized_private_key.data(),
                                      serialized_private_key.size()));
  BOOST_TEST(!picnic_read_public_key(&gen_public_key, serialized_public_key.data(),
                                     serialized_public_key.size()));

  std::vector<uint8_t> sig;
  sig.resize(max_signature_size);
  size_t siglen = max_signature_size;

  // Sign a message
  BOOST_TEST(!PICNIC_CONCAT(PARAM, sign)(&private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
  BOOST_TEST(!picnic_verify(&gen_public_key, m.data(), m.size(), sig.data(), siglen));

  siglen = max_signature_size;
  // Sign another message
  BOOST_TEST(!picnic_sign(&gen_private_key, m.data(), m.size(), sig.data(), &siglen));
  BOOST_TEST(siglen > 0);
  BOOST_TEST(siglen <= max_signature_size);
  // Verify signature
  BOOST_TEST(!PICNIC_CONCAT(PARAM, verify)(&public_key, m.data(), m.size(), sig.data(), siglen));
  BOOST_TEST(!picnic_verify(&gen_public_key, m.data(), m.size(), sig.data(), siglen));
}